

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arithmetic.cpp
# Opt level: O2

ScalarFunctionSet * duckdb::OperatorModuloFun::GetFunctions(void)

{
  vector<duckdb::ScalarFunction,_true> *this;
  pointer pSVar1;
  LogicalType varargs;
  LogicalType varargs_00;
  LogicalType varargs_01;
  ScalarFunction *func;
  pointer function;
  ScalarFunctionSet *in_RDI;
  long lVar2;
  pointer other;
  initializer_list<duckdb::LogicalType> __l;
  initializer_list<duckdb::LogicalType> __l_00;
  initializer_list<duckdb::LogicalType> __l_01;
  undefined4 in_stack_fffffffffffff9d4;
  undefined4 in_stack_fffffffffffff9dc;
  FunctionNullHandling in_stack_fffffffffffff9e8;
  allocator_type local_611;
  LogicalType local_600 [2];
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_5d0;
  LogicalType local_5b8;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_5a0;
  LogicalType local_588;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_570;
  LogicalType local_558;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_540;
  _Any_data local_528;
  undefined8 local_518;
  undefined8 uStack_510;
  _Any_data local_508;
  undefined8 local_4f8;
  undefined8 uStack_4f0;
  scalar_function_t local_4e0;
  LogicalType local_4c0;
  LogicalType local_4a8;
  string local_490;
  LogicalType local_470;
  ScalarFunction local_458;
  ScalarFunction local_330;
  ScalarFunction local_208;
  BaseScalarFunction local_e0;
  
  ::std::__cxx11::string::string((string *)&local_490,"%",(allocator *)local_600);
  ScalarFunctionSet::ScalarFunctionSet(in_RDI,&local_490);
  ::std::__cxx11::string::~string((string *)&local_490);
  LogicalType::Numeric();
  this = &(in_RDI->super_FunctionSet<duckdb::ScalarFunction>).functions;
  for (other = local_5d0.
               super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl
               .super__Vector_impl_data._M_start;
      other != local_5d0.
               super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl
               .super__Vector_impl_data._M_finish; other = other + 1) {
    if (other->id_ - 0x16 < 2) {
      LogicalType::LogicalType(local_600,other);
      LogicalType::LogicalType(local_600 + 1,other);
      __l._M_len = 2;
      __l._M_array = local_600;
      ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
                (&local_540,__l,&local_611);
      LogicalType::LogicalType(&local_558,other);
      local_4f8 = 0;
      uStack_4f0 = 0;
      local_508._M_unused._M_object = (void *)0x0;
      local_508._8_8_ = 0;
      LogicalType::LogicalType(&local_4a8,INVALID);
      varargs.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_4_ = 0;
      varargs._0_8_ = &local_4a8;
      varargs.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr._4_4_ =
           in_stack_fffffffffffff9d4;
      varargs.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_4_
           = 0;
      varargs.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_
           = in_stack_fffffffffffff9dc;
      ScalarFunction::ScalarFunction
                (&local_208,(vector<duckdb::LogicalType,_true> *)&local_540,&local_558,
                 (scalar_function_t *)&local_508,BindBinaryFloatingPoint<duckdb::ModuloOperator>,
                 (bind_scalar_function_extended_t)0x0,(function_statistics_t)0x0,
                 (init_local_state_t)0x0,varargs,CONSISTENT,in_stack_fffffffffffff9e8,
                 (bind_lambda_function_t)in_RDI);
      ::std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::
      emplace_back<duckdb::ScalarFunction>
                (&this->
                  super_vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>,
                 &local_208);
      ScalarFunction::~ScalarFunction(&local_208);
      LogicalType::~LogicalType(&local_4a8);
      ::std::_Function_base::~_Function_base((_Function_base *)&local_508);
      LogicalType::~LogicalType(&local_558);
      ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_540);
      lVar2 = 0x18;
      do {
        LogicalType::~LogicalType((LogicalType *)(&local_600[0].id_ + lVar2));
        lVar2 = lVar2 + -0x18;
      } while (lVar2 != -0x18);
    }
    else if (other->id_ == DECIMAL) {
      LogicalType::LogicalType(local_600,other);
      LogicalType::LogicalType(local_600 + 1,other);
      __l_00._M_len = 2;
      __l_00._M_array = local_600;
      ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
                (&local_570,__l_00,&local_611);
      LogicalType::LogicalType(&local_588,other);
      local_518 = 0;
      uStack_510 = 0;
      local_528._M_unused._M_object = (void *)0x0;
      local_528._8_8_ = 0;
      LogicalType::LogicalType(&local_4c0,INVALID);
      varargs_00.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_4_ = 0;
      varargs_00._0_8_ = &local_4c0;
      varargs_00.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr._4_4_ =
           in_stack_fffffffffffff9d4;
      varargs_00.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_4_
           = 0;
      varargs_00.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_
           = in_stack_fffffffffffff9dc;
      ScalarFunction::ScalarFunction
                (&local_330,(vector<duckdb::LogicalType,_true> *)&local_570,&local_588,
                 (scalar_function_t *)&local_528,BindDecimalModulo<duckdb::ModuloOperator>,
                 (bind_scalar_function_extended_t)0x0,(function_statistics_t)0x0,
                 (init_local_state_t)0x0,varargs_00,CONSISTENT,in_stack_fffffffffffff9e8,
                 (bind_lambda_function_t)in_RDI);
      ::std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::
      emplace_back<duckdb::ScalarFunction>
                (&this->
                  super_vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>,
                 &local_330);
      ScalarFunction::~ScalarFunction(&local_330);
      LogicalType::~LogicalType(&local_4c0);
      ::std::_Function_base::~_Function_base((_Function_base *)&local_528);
      LogicalType::~LogicalType(&local_588);
      ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_570);
      lVar2 = 0x18;
      do {
        LogicalType::~LogicalType((LogicalType *)(&local_600[0].id_ + lVar2));
        lVar2 = lVar2 + -0x18;
      } while (lVar2 != -0x18);
    }
    else {
      LogicalType::LogicalType(local_600,other);
      LogicalType::LogicalType(local_600 + 1,other);
      __l_01._M_len = 2;
      __l_01._M_array = local_600;
      ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
                (&local_5a0,__l_01,&local_611);
      LogicalType::LogicalType(&local_5b8,other);
      GetBinaryFunctionIgnoreZero<duckdb::ModuloOperator>(&local_4e0,other->physical_type_);
      LogicalType::LogicalType(&local_470,INVALID);
      varargs_01.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_4_ = 0;
      varargs_01._0_8_ = &local_470;
      varargs_01.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr._4_4_ =
           in_stack_fffffffffffff9d4;
      varargs_01.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_4_
           = 0;
      varargs_01.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_
           = in_stack_fffffffffffff9dc;
      ScalarFunction::ScalarFunction
                (&local_458,(vector<duckdb::LogicalType,_true> *)&local_5a0,&local_5b8,&local_4e0,
                 (bind_scalar_function_t)0x0,(bind_scalar_function_extended_t)0x0,
                 (function_statistics_t)0x0,(init_local_state_t)0x0,varargs_01,CONSISTENT,
                 in_stack_fffffffffffff9e8,(bind_lambda_function_t)in_RDI);
      ::std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::
      emplace_back<duckdb::ScalarFunction>
                (&this->
                  super_vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>,
                 &local_458);
      ScalarFunction::~ScalarFunction(&local_458);
      LogicalType::~LogicalType(&local_470);
      ::std::_Function_base::~_Function_base(&local_4e0.super__Function_base);
      LogicalType::~LogicalType(&local_5b8);
      ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_5a0);
      lVar2 = 0x18;
      do {
        LogicalType::~LogicalType((LogicalType *)(&local_600[0].id_ + lVar2));
        lVar2 = lVar2 + -0x18;
      } while (lVar2 != -0x18);
    }
  }
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_5d0);
  pSVar1 = (in_RDI->super_FunctionSet<duckdb::ScalarFunction>).functions.
           super_vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>.
           super__Vector_base<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  for (function = (in_RDI->super_FunctionSet<duckdb::ScalarFunction>).functions.
                  super_vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>.
                  super__Vector_base<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>
                  ._M_impl.super__Vector_impl_data._M_start; function != pSVar1;
      function = function + 1) {
    BaseScalarFunction::SetReturnsError(&local_e0,&function->super_BaseScalarFunction);
    BaseScalarFunction::~BaseScalarFunction(&local_e0);
  }
  return in_RDI;
}

Assistant:

ScalarFunctionSet OperatorModuloFun::GetFunctions() {
	ScalarFunctionSet modulo("%");
	for (auto &type : LogicalType::Numeric()) {
		if (type.id() == LogicalTypeId::FLOAT || type.id() == LogicalTypeId::DOUBLE) {
			modulo.AddFunction(ScalarFunction({type, type}, type, nullptr, BindBinaryFloatingPoint<ModuloOperator>));
		} else if (type.id() == LogicalTypeId::DECIMAL) {
			modulo.AddFunction(ScalarFunction({type, type}, type, nullptr, BindDecimalModulo<ModuloOperator>));
		} else {
			modulo.AddFunction(
			    ScalarFunction({type, type}, type, GetBinaryFunctionIgnoreZero<ModuloOperator>(type.InternalType())));
		}
	}
	for (auto &func : modulo.functions) {
		ScalarFunction::SetReturnsError(func);
	}

	return modulo;
}